

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall ThreadPool::start(ThreadPool *this)

{
  uint uVar1;
  thread tStack_48;
  __shared_ptr<ThreadPool,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->m_isRunning = true;
  for (uVar1 = 0; uVar1 < this->m_threadnum; uVar1 = uVar1 + 1) {
    std::__shared_ptr<ThreadPool,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ThreadPool,void>
              (local_40,(__weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::thread::
    thread<std::shared_ptr<ThreadPool>(&)(std::shared_ptr<ThreadPool>),std::shared_ptr<ThreadPool>,void>
              (&tStack_48,threadfun,(shared_ptr<ThreadPool> *)local_40);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&this->m_threads,&tStack_48);
    std::thread::~thread(&tStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return;
}

Assistant:

void ThreadPool::start()
{
	m_isRunning=true;
	for (int i = 0; i < m_threadnum; i++) {	
		m_threads.push_back(std::thread(threadfun,shared_from_this()));
		
	}
}